

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O3

void __thiscall absl::base_internal::SpinLock::SlowLock(SpinLock *this)

{
  uint32_t uVar1;
  uint uVar2;
  __int_type_conflict1 _Var3;
  uint32_t uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  SchedulingMode SVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  
  uVar4 = SpinLoop(this);
  if ((uVar4 & 1) == 0) {
    LOCK();
    uVar1 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
    if (uVar4 == uVar1) {
      (this->lockword_).super___atomic_base<unsigned_int>._M_i = uVar4 | 1;
      uVar1 = uVar4;
    }
    uVar4 = uVar1;
    UNLOCK();
    if ((uVar4 & 1) == 0) {
      return;
    }
  }
  SVar9 = uVar4 >> 1;
  if (CycleClock::cycle_clock_source_ == (code *)0x0) {
    lVar5 = rdtsc();
  }
  else {
    lVar5 = (*CycleClock::cycle_clock_source_)();
  }
  iVar11 = 0;
  uVar8 = 0;
  do {
    uVar10 = uVar4;
    if (uVar4 < 8) {
      uVar10 = uVar4 | 8;
      LOCK();
      uVar2 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
      bVar12 = uVar4 == uVar2;
      if (bVar12) {
        (this->lockword_).super___atomic_base<unsigned_int>._M_i = uVar10;
        uVar2 = uVar4;
      }
      uVar4 = uVar2;
      UNLOCK();
      if (bVar12) goto LAB_00114b25;
      if ((uVar4 & 1) == 0) goto LAB_00114afa;
      uVar10 = uVar4;
      if (7 < uVar4) goto LAB_00114b25;
    }
    else {
LAB_00114b25:
      iVar11 = iVar11 + 1;
      AbslInternalSpinLockDelay
                (&this->lockword_,uVar10,iVar11,SVar9 & SCHEDULE_COOPERATIVE_AND_KERNEL);
      uVar4 = SpinLoop(this);
      if (CycleClock::cycle_clock_source_ == (code *)0x0) {
        lVar6 = rdtsc();
      }
      else {
        lVar6 = (*CycleClock::cycle_clock_source_)();
      }
      uVar7 = (lVar6 >> 2) - (lVar5 >> 2) >> 7;
      if (0x1ffffffe < (long)uVar7) {
        uVar7 = 0x1fffffff;
      }
      uVar10 = (int)uVar7 << 3;
      uVar8 = 8;
      if (((uVar7 & 0x1fffffff) != 0) && (uVar8 = uVar10, uVar10 == 8)) {
        uVar8 = 0x10;
      }
      if ((uVar4 & 1) == 0) {
LAB_00114afa:
        LOCK();
        _Var3 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
        if (uVar4 == _Var3) {
          (this->lockword_).super___atomic_base<unsigned_int>._M_i = uVar4 | uVar8 | 1;
          _Var3 = uVar4;
        }
        uVar4 = _Var3;
        UNLOCK();
      }
    }
    if ((uVar4 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void SpinLock::SlowLock() {
  uint32_t lock_value = SpinLoop();
  lock_value = TryLockInternal(lock_value, 0);
  if ((lock_value & kSpinLockHeld) == 0) {
    return;
  }

  base_internal::SchedulingMode scheduling_mode;
  if ((lock_value & kSpinLockCooperative) != 0) {
    scheduling_mode = base_internal::SCHEDULE_COOPERATIVE_AND_KERNEL;
  } else {
    scheduling_mode = base_internal::SCHEDULE_KERNEL_ONLY;
  }

  // The lock was not obtained initially, so this thread needs to wait for
  // it.  Record the current timestamp in the local variable wait_start_time
  // so the total wait time can be stored in the lockword once this thread
  // obtains the lock.
  int64_t wait_start_time = CycleClock::Now();
  uint32_t wait_cycles = 0;
  int lock_wait_call_count = 0;
  while ((lock_value & kSpinLockHeld) != 0) {
    // If the lock is currently held, but not marked as having a sleeper, mark
    // it as having a sleeper.
    if ((lock_value & kWaitTimeMask) == 0) {
      // Here, just "mark" that the thread is going to sleep.  Don't store the
      // lock wait time in the lock -- the lock word stores the amount of time
      // that the current holder waited before acquiring the lock, not the wait
      // time of any thread currently waiting to acquire it.
      if (lockword_.compare_exchange_strong(
              lock_value, lock_value | kSpinLockSleeper,
              std::memory_order_relaxed, std::memory_order_relaxed)) {
        // Successfully transitioned to kSpinLockSleeper.  Pass
        // kSpinLockSleeper to the SpinLockWait routine to properly indicate
        // the last lock_value observed.
        lock_value |= kSpinLockSleeper;
      } else if ((lock_value & kSpinLockHeld) == 0) {
        // Lock is free again, so try and acquire it before sleeping.  The
        // new lock state will be the number of cycles this thread waited if
        // this thread obtains the lock.
        lock_value = TryLockInternal(lock_value, wait_cycles);
        continue;   // Skip the delay at the end of the loop.
      } else if ((lock_value & kWaitTimeMask) == 0) {
        // The lock is still held, without a waiter being marked, but something
        // else about the lock word changed, causing our CAS to fail. For
        // example, a new lock holder may have acquired the lock with
        // kSpinLockDisabledScheduling set, whereas the previous holder had not
        // set that flag. In this case, attempt again to mark ourselves as a
        // waiter.
        continue;
      }
    }

    // SpinLockDelay() calls into fiber scheduler, we need to see
    // synchronization there to avoid false positives.
    ABSL_TSAN_MUTEX_PRE_DIVERT(this, 0);
    // Wait for an OS specific delay.
    base_internal::SpinLockDelay(&lockword_, lock_value, ++lock_wait_call_count,
                                 scheduling_mode);
    ABSL_TSAN_MUTEX_POST_DIVERT(this, 0);
    // Spin again after returning from the wait routine to give this thread
    // some chance of obtaining the lock.
    lock_value = SpinLoop();
    wait_cycles = EncodeWaitCycles(wait_start_time, CycleClock::Now());
    lock_value = TryLockInternal(lock_value, wait_cycles);
  }
}